

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void mg_send_mime_file2(mg_connection *conn,char *path,char *mime_type,char *additional_headers)

{
  long *plVar1;
  char cVar2;
  mg_domain_context *pmVar3;
  size_t dst_len;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  DIR *__dirp;
  dirent64 *pdVar10;
  ptrdiff_t pVar11;
  int *piVar12;
  char *pcVar13;
  undefined8 *puVar14;
  size_t sVar15;
  char *__ptr;
  size_t sVar16;
  tm *__tp;
  ulong uVar17;
  int iVar18;
  char *pcVar19;
  mg_file_stat *filep;
  char *func;
  time_t *t;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  de *a;
  undefined8 *puVar25;
  bool bVar26;
  double dVar27;
  undefined1 auVar28 [16];
  ulong local_1170;
  undefined8 *local_1168;
  ulong local_1160;
  int local_114c;
  undefined8 *local_1148;
  undefined8 *local_1140;
  long local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  undefined8 *local_1118;
  undefined8 *local_1110;
  char *local_1108;
  ulong local_1100;
  ulong local_10f8;
  time_t local_10f0;
  mg_file file;
  de de;
  char date [64];
  char path_1 [4096];
  
  file.stat.is_directory = 0;
  file.stat.is_gzipped = 0;
  file.stat.location = 0;
  file.stat._28_4_ = 0;
  file.stat.size = 0;
  file.stat.last_modified = 0;
  file.access.fp = (FILE *)0x0;
  if (conn == (mg_connection *)0x0) {
    return;
  }
  iVar7 = mg_stat((mg_connection *)path,(char *)&file,(mg_file_stat *)mime_type);
  if (iVar7 == 0) {
    pcVar19 = "Error: File not found";
    iVar7 = 0x194;
LAB_0010fa65:
    mg_send_http_error(conn,iVar7,"%s",pcVar19);
    return;
  }
  if (file.stat.is_directory == 0) {
    handle_static_file_request(conn,path,&file,mime_type,additional_headers);
    return;
  }
  iVar7 = mg_strcasecmp(conn->dom_ctx->config[0x21],"yes");
  if (iVar7 != 0) {
    pcVar19 = "Error: Directory listing denied";
    iVar7 = 0x193;
    goto LAB_0010fa65;
  }
  local_10f0 = time((time_t *)0x0);
  __dirp = opendir(path);
  if (__dirp == (DIR *)0x0) {
    piVar12 = __errno_location();
    pcVar19 = strerror(*piVar12);
    mg_send_http_error(conn,500,"Error: Cannot open directory\nopendir(%s): %s",path,pcVar19);
    return;
  }
  local_1170 = 0x80;
  local_1160 = 0;
  local_1168 = (undefined8 *)0x0;
  while (pdVar10 = readdir64(__dirp), pdVar10 != (dirent64 *)0x0) {
    if ((pdVar10->d_name[0] != '.') ||
       ((pdVar10->d_name[1] != '\0' && ((pdVar10->d_name[1] != '.' || (pdVar10->d_name[2] != '\0')))
        ))) {
      pcVar19 = pdVar10->d_name;
      pmVar3 = conn->dom_ctx;
      if ((pmVar3 == (mg_domain_context *)0x0) ||
         ((pVar11 = match_prefix_strlen("**.htpasswd$",pcVar19), pVar11 < 1 &&
          (pVar11 = match_prefix_strlen(pmVar3->config[0x2a],pcVar19), pVar11 < 1)))) {
        mg_snprintf(conn,&local_114c,path_1,0x1000,"%s/%s",path,pcVar19);
        de.file.is_directory = 0;
        de.file.is_gzipped = 0;
        de.file.location = 0;
        de.file._28_4_ = 0;
        de.file.size = 0;
        de.file.last_modified = 0;
        if (local_114c == 0) {
          iVar7 = mg_stat((mg_connection *)path_1,(char *)&de.file,filep);
          if (iVar7 == 0) {
            piVar12 = __errno_location();
            pcVar13 = strerror(*piVar12);
            mg_cry_internal_wrap
                      (conn,(mg_context *)0x0,func,(uint)path_1,"%s: mg_stat(%s) failed: %s",
                       "scan_directory",path_1,pcVar13);
          }
          puVar14 = local_1168;
          de.file_name = pcVar19;
          if (local_1168 == (undefined8 *)0x0 || local_1170 <= local_1160) {
            puVar14 = (undefined8 *)realloc(local_1168,local_1170 * 0x50);
            if (puVar14 == (undefined8 *)0x0) break;
            local_1170 = local_1170 * 2;
          }
          pcVar19 = mg_strdup(de.file_name);
          puVar14[local_1160 * 5] = pcVar19;
          local_1168 = puVar14;
          if (pcVar19 == (char *)0x0) break;
          puVar14[local_1160 * 5 + 3] = de.file._16_8_;
          (puVar14 + local_1160 * 5 + 3)[1] = de.file._24_8_;
          puVar14[local_1160 * 5 + 1] = de.file.size;
          (puVar14 + local_1160 * 5 + 1)[1] = de.file.last_modified;
          local_1160 = local_1160 + 1;
        }
      }
    }
  }
  closedir(__dirp);
  gmt_time_string(date,(size_t)&local_10f0,t);
  pcVar19 = (conn->request_info).local_uri;
  sVar15 = strcspn(pcVar19,"&<>");
  if (pcVar19[sVar15] != '\0') {
    sVar15 = strlen(pcVar19);
    __ptr = (char *)malloc(sVar15 * 5 + 1);
    pcVar13 = pcVar19;
    pcVar24 = __ptr;
    if (__ptr != (char *)0x0) {
      for (; *pcVar13 != '\0'; pcVar13 = pcVar13 + 1) {
        mg_strlcpy(pcVar24,pcVar13,2);
        cVar2 = *pcVar24;
        if (cVar2 == '>') {
          builtin_strncpy(pcVar24,"&gt;",5);
        }
        else if (cVar2 == '<') {
          builtin_strncpy(pcVar24,"&lt;",5);
        }
        else if (cVar2 == '&') {
          builtin_strncpy(pcVar24,"&amp;",6);
        }
        sVar15 = strlen(pcVar24);
        pcVar24 = pcVar24 + sVar15;
      }
      goto LAB_0010fd82;
    }
    pcVar19 = "";
  }
  __ptr = (char *)0x0;
LAB_0010fd82:
  pcVar13 = (conn->request_info).query_string;
  uVar17 = 100;
  if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
    uVar17 = (ulong)((uint)(pcVar13[1] != 'd') * 3 + 0x61);
  }
  conn->must_close = 1;
  mg_response_header_start(conn,200);
  send_no_cache_header(conn);
  send_additional_header(conn);
  mg_response_header_add(conn,"Content-Type","text/html; charset=utf-8",-1);
  mg_response_header_send(conn);
  if (__ptr != (char *)0x0) {
    pcVar19 = __ptr;
  }
  mg_printf(conn,
            "<!DOCTYPE html><html><head><title>Index of %s</title><style>th {text-align: left;}</style></head><body><h1>Index of %s</h1><pre><table cellpadding=\"0\"><tr><th><a href=\"?n%c\">Name</a></th><th><a href=\"?d%c\">Modified</a></th><th><a href=\"?s%c\">Size</a></th></tr><tr><td colspan=\"3\"><hr></td></tr>"
            ,pcVar19,pcVar19,uVar17,uVar17,uVar17);
  free(__ptr);
  mg_printf(conn,"<tr><td><a href=\"%s\">%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
            ,"..","Parent directory","-","-");
  if (local_1168 != (undefined8 *)0x0) {
    pcVar19 = (conn->request_info).query_string;
    local_1128 = local_1160 >> 1;
    if (pcVar19 == (char *)0x0) {
      pcVar19 = "";
    }
    local_1108 = pcVar19;
    for (uVar8 = 8; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      uVar17 = *(ulong *)(&DAT_001285a0 + (ulong)uVar8 * 8);
      if (uVar17 <= local_1128) {
        local_1140 = local_1168 + uVar17 * -5;
        uVar21 = 0;
        uVar22 = uVar17;
        local_1148 = local_1168;
        local_1100 = uVar17;
        while (puVar14 = local_1148, puVar25 = local_1140, uVar23 = uVar21, uVar21 != uVar22) {
LAB_0010fee1:
          local_1120 = uVar23;
          if (uVar21 < local_1160) {
            pcVar13 = (char *)local_1168[uVar21 * 5];
            local_1130 = local_1168[uVar21 * 5 + 1];
            local_1138 = local_1168[uVar21 * 5 + 2];
            iVar7 = *(int *)(local_1168 + uVar21 * 5 + 3);
            path_1._8_4_ = *(undefined4 *)(uVar21 * 0x28 + 0x24 + (long)local_1168);
            path_1._0_8_ = *(undefined8 *)(uVar21 * 0x28 + 0x1c + (long)local_1168);
            uVar23 = uVar21;
            local_1118 = puVar14;
            local_1110 = puVar25;
            local_10f8 = uVar21;
            do {
              bVar26 = uVar21 < uVar22;
              uVar21 = uVar21 - uVar22;
              if ((bVar26) || (puVar25 == (undefined8 *)0x0)) goto LAB_0011000b;
              pcVar24 = pcVar19;
              if (*pcVar19 == '\0') {
                pcVar24 = "n";
              }
              if (*(int *)(puVar25 + 3) == 0) {
                if (iVar7 == 0) goto LAB_0010ff69;
              }
              else {
                if (iVar7 == 0) goto LAB_0011000b;
LAB_0010ff69:
                if (*pcVar24 == 'd') {
                  bVar26 = local_1138 < (long)puVar25[2];
                  if (puVar25[2] != local_1138) goto LAB_0010ffc7;
LAB_0010ff88:
                  iVar9 = strcmp((char *)*puVar25,pcVar13);
                  pcVar19 = local_1108;
                  uVar22 = local_1100;
                  uVar23 = local_10f8;
                }
                else {
                  if ((*pcVar24 != 's') ||
                     (bVar26 = local_1130 < (ulong)puVar25[1], puVar25[1] == local_1130))
                  goto LAB_0010ff88;
LAB_0010ffc7:
                  iVar9 = (uint)bVar26 * 2 + -1;
                }
                iVar18 = -iVar9;
                if (pcVar24[1] != 'd') {
                  iVar18 = iVar9;
                }
                if (iVar18 < 1) goto LAB_0011000b;
              }
              puVar14[4] = puVar25[4];
              uVar5 = *puVar25;
              uVar6 = puVar25[1];
              uVar4 = puVar25[3];
              puVar14[2] = puVar25[2];
              puVar14[3] = uVar4;
              *puVar14 = uVar5;
              puVar14[1] = uVar6;
              puVar14 = puVar14 + uVar17 * -5;
              puVar25 = puVar25 + uVar17 * -5;
            } while( true );
          }
          local_1148 = local_1148 + 5;
          local_1140 = local_1140 + 5;
          uVar21 = local_1120 + 1;
        }
      }
    }
    for (uVar17 = 0; uVar17 != local_1160; uVar17 = uVar17 + 1) {
      plVar1 = local_1168 + uVar17 * 5;
      pcVar19 = (char *)local_1168[uVar17 * 5];
      sVar15 = strlen(pcVar19);
      sVar16 = strcspn(pcVar19,"&<>");
      lVar20 = 0;
      if (pcVar19[sVar16] != '\0') {
        lVar20 = (sVar15 + 1) * 5;
      }
      dst_len = (sVar15 + 1) * 3;
      pcVar13 = (char *)malloc(lVar20 + dst_len);
      if (pcVar13 != (char *)0x0) {
        mg_url_encode(pcVar19,pcVar13,dst_len);
        if (lVar20 == 0) {
          pcVar19 = (char *)0x0;
        }
        else {
          pcVar19 = pcVar13 + dst_len;
          pcVar24 = pcVar19;
          for (lVar20 = 0; *(char *)(*plVar1 + lVar20) != '\0'; lVar20 = lVar20 + 1) {
            mg_strlcpy(pcVar24,(char *)(*plVar1 + lVar20),2);
            cVar2 = *pcVar24;
            if (cVar2 == '>') {
              builtin_strncpy(pcVar24,"&gt;",5);
            }
            else if (cVar2 == '<') {
              builtin_strncpy(pcVar24,"&lt;",5);
            }
            else if (cVar2 == '&') {
              builtin_strncpy(pcVar24,"&amp;",6);
            }
            sVar15 = strlen(pcVar24);
            pcVar24 = pcVar24 + sVar15;
          }
        }
        if ((int)plVar1[3] == 0) {
          uVar22 = plVar1[1];
          if (uVar22 < 0x400) {
            mg_snprintf(conn,(int *)0x0,path_1,0x40,"%d");
          }
          else {
            if (uVar22 < 0x100000) {
              dVar27 = (double)(long)uVar22 * 0.0009765625;
              pcVar24 = "%.1fk";
            }
            else {
              auVar28._8_4_ = (int)(uVar22 >> 0x20);
              auVar28._0_8_ = uVar22;
              auVar28._12_4_ = 0x45300000;
              dVar27 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0);
              if (uVar22 < 0x40000000) {
                dVar27 = dVar27 * 9.5367431640625e-07;
                pcVar24 = "%.1fM";
              }
              else {
                dVar27 = dVar27 * 9.313225746154785e-10;
                pcVar24 = "%.1fG";
              }
            }
            mg_snprintf(conn,(int *)0x0,path_1,0x40,pcVar24,dVar27);
          }
        }
        else {
          mg_snprintf(conn,(int *)0x0,path_1,0x40,"%s","[DIRECTORY]");
        }
        __tp = localtime(plVar1 + 2);
        if (__tp == (tm *)0x0) {
          mg_strlcpy((char *)&de,"01-Jan-1970 00:00",0x40);
        }
        else {
          strftime((char *)&de,0x40,"%d-%b-%Y %H:%M",__tp);
        }
        pcVar24 = "/";
        if ((int)plVar1[3] == 0) {
          pcVar24 = "";
        }
        if (pcVar19 == (char *)0x0) {
          pcVar19 = (char *)*plVar1;
        }
        mg_printf(conn,
                  "<tr><td><a href=\"%s%s\">%s%s</a></td><td>&nbsp;%s</td><td>&nbsp;&nbsp;%s</td></tr>\n"
                  ,pcVar13,pcVar24,pcVar19,pcVar24,&de,path_1);
        free(pcVar13);
      }
      free((void *)*plVar1);
    }
    free(local_1168);
  }
  mg_printf(conn,"%s","</table></pre></body></html>");
  conn->status_code = 200;
  return;
LAB_0011000b:
  *puVar14 = pcVar13;
  puVar14[1] = local_1130;
  puVar14[2] = local_1138;
  *(int *)(puVar14 + 3) = iVar7;
  *(undefined8 *)((long)puVar14 + 0x1c) = path_1._0_8_;
  *(undefined4 *)((long)puVar14 + 0x24) = path_1._8_4_;
  uVar21 = uVar23 + uVar22;
  puVar14 = local_1118 + uVar17 * 5;
  puVar25 = local_1110 + uVar17 * 5;
  uVar23 = local_1120;
  goto LAB_0010fee1;
}

Assistant:

CIVETWEB_API void
mg_send_mime_file2(struct mg_connection *conn,
                   const char *path,
                   const char *mime_type,
                   const char *additional_headers)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;

	if (!conn) {
		/* No conn */
		return;
	}

	if (mg_stat(conn, path, &file.stat)) {
#if !defined(NO_CACHING)
		if (is_not_modified(conn, &file.stat)) {
			/* Send 304 "Not Modified" - this must not send any body data */
			handle_not_modified_static_file_request(conn, &file);
		} else
#endif /* NO_CACHING */
		    if (file.stat.is_directory) {
			if (!mg_strcasecmp(conn->dom_ctx->config[ENABLE_DIRECTORY_LISTING],
			                   "yes")) {
				handle_directory_request(conn, path);
			} else {
				mg_send_http_error(conn,
				                   403,
				                   "%s",
				                   "Error: Directory listing denied");
			}
		} else {
			handle_static_file_request(
			    conn, path, &file, mime_type, additional_headers);
		}
	} else {
		mg_send_http_error(conn, 404, "%s", "Error: File not found");
	}
}